

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

void __thiscall GGSock::Communicator::Data::Data(Data *this,bool startOwnWorker)

{
  byte in_SIL;
  type *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *__m;
  function<void_(short)> *this_00;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
  *in_stack_ffffffffffffffb0;
  type *__x;
  size_type in_stack_ffffffffffffffc8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  *(undefined1 *)&in_RDI->this = 1;
  *(undefined1 *)((long)&in_RDI->this + 1) = 0;
  *(undefined1 *)((long)&in_RDI->this + 2) = 0;
  *(undefined1 *)((long)&in_RDI->this + 3) = 0;
  *(undefined1 *)((long)&in_RDI->this + 4) = 0;
  *(undefined4 *)&in_RDI[1].this = 0;
  *(undefined4 *)((long)&in_RDI[1].this + 4) = 0;
  *(undefined4 *)&in_RDI[2].this = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[2].this + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[3].this = 0xffffffff;
  *(undefined4 *)&in_RDI[0x2a].this = 0;
  *(undefined4 *)((long)&in_RDI[0x2a].this + 4) = 0;
  *(undefined2 *)&in_RDI[0x2b].this = 0xffff;
  *(undefined4 *)((long)&in_RDI[0x2b].this + 4) = 0;
  *(undefined4 *)&in_RDI[0x2c].this = 0;
  __m = (mutex_type *)(in_RDI + 0x2d);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_128UL>
  ::array(in_stack_ffffffffffffffb0);
  this_00 = (function<void_(short)> *)(in_RDI + 0x22d);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x12dfd9);
  std::mutex::mutex((mutex *)0x12dfea);
  std::mutex::mutex((mutex *)0x12dffb);
  std::thread::thread((thread *)0x12e011);
  std::function<void_(short)>::function(this_00,__m);
  __x = in_RDI + 0x241;
  std::
  map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
  ::map((map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
         *)0x12e041);
  if ((Data::isFirst & 1U) != 0) {
    signal(0xd,(__sighandler_t)0x1);
    Data::isFirst = false;
  }
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,__m);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(value_type *)__x);
  if ((in_SIL & 1) != 0) {
    *(undefined1 *)((long)&in_RDI->this + 4) = 1;
    std::thread::thread<GGSock::Communicator::Data::Data(bool)::_lambda()_1_,,void>
              ((thread *)in_stack_ffffffffffffffd0,in_RDI);
    std::thread::operator=((thread *)this_00,(thread *)__m);
    std::thread::~thread((thread *)0x12e0e6);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12e11c);
  return;
}

Assistant:

Data(bool startOwnWorker) {
            // todo : maybe move this to a static method
            static bool isFirst = true;
            if (isFirst) {
#ifdef _WIN32
                // Initialize Winsock
                WSADATA wsaData;
                int iResult = WSAStartup(MAKEWORD(2,2), &wsaData);
                if (iResult != 0) {
                    printf("WSAStartup failed with error: %d\n", iResult);
                    return;
                }
#endif

#ifndef _WIN32
                // this is needed to avoid program crash upon sending data to disconnected clients
                signal(SIGPIPE, SIG_IGN);
#endif

                isFirst = false;
            }

            std::lock_guard<std::mutex> lock(mutex);

            bufferDataRecv.resize(256*1024, 0);

            if (startOwnWorker) {
                isRunning = true;
                worker = std::thread([this]() {
                    while (isRunning) {
                        update();
                        std::this_thread::sleep_for(std::chrono::milliseconds(1));
                    }
                });
            }
        }